

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError xmlCharEncInput(xmlParserInputBufferPtr input,size_t *sizeOut,int flush)

{
  xmlBufPtr pxVar1;
  xmlCharEncodingHandler *handler;
  xmlCharEncError xVar2;
  int iVar3;
  size_t sVar4;
  xmlChar *in;
  size_t sVar5;
  xmlChar *out;
  size_t len;
  unsigned_long uVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  ulong len_00;
  bool bVar11;
  int c_in;
  int c_out;
  xmlCharEncError local_74;
  int local_70;
  int local_6c;
  xmlParserInputBufferPtr local_68;
  size_t local_60;
  int local_54;
  xmlBufPtr local_50;
  ulong local_48;
  xmlBufPtr local_40;
  size_t *local_38;
  
  local_50 = input->buffer;
  pxVar1 = input->raw;
  uVar8 = *sizeOut;
  *sizeOut = 0;
  local_68 = input;
  sVar4 = xmlBufUse(pxVar1);
  xVar2 = XML_ENC_ERR_SUCCESS;
  if (flush != 0 || sVar4 != 0) {
    local_54 = flush;
    local_40 = pxVar1;
    local_38 = sizeOut;
    in = xmlBufContent(pxVar1);
    len_00 = 0;
    sVar10 = 0;
    do {
      pxVar1 = local_50;
      bVar11 = local_54 != 0;
      local_60 = sVar10;
      sVar5 = xmlBufAvail(local_50);
      if (0x3ffffffe < sVar5) {
        sVar5 = 0x3fffffff;
      }
      local_6c = (int)uVar8;
      if (sVar5 < uVar8) {
        local_6c = (int)sVar5;
      }
      local_70 = 0x3fffffff;
      if (sVar4 < 0x40000000) {
        local_70 = (int)sVar4;
      }
      handler = local_68->encoder;
      local_48 = uVar8;
      out = xmlBufEnd(pxVar1);
      xVar2 = xmlEncInputChunk(handler,out,&local_6c,in,&local_70,
                               (uint)(sVar4 < 0x40000000 && bVar11));
      lVar9 = (long)local_70;
      len = (size_t)local_6c;
      xmlBufAddLen(pxVar1,len);
      uVar8 = local_48;
      sVar10 = local_60;
      switch(xVar2) {
      case XML_ENC_ERR_MEMORY:
        iVar3 = 2;
        break;
      case XML_ENC_ERR_SPACE:
      case XML_ENC_ERR_SUCCESS:
        if ((((0x3fffffff < sVar4) || (cVar7 = '\x03', sVar5 < local_48)) &&
            (cVar7 = (xVar2 == XML_ENC_ERR_SUCCESS && sVar4 < 0x40000000 ||
                     xVar2 == XML_ENC_ERR_SPACE && local_48 <= sVar5) * '\x03',
            (xVar2 != XML_ENC_ERR_SUCCESS || sVar4 >= 0x40000000) &&
            (xVar2 != XML_ENC_ERR_SPACE || local_48 > sVar5))) && (xVar2 == XML_ENC_ERR_SPACE)) {
          iVar3 = xmlBufGrow(local_50,0x1000);
          cVar7 = '\0';
          if (iVar3 < 0) {
            local_68->error = 2;
            cVar7 = '\x01';
            local_74 = XML_ENC_ERR_MEMORY;
          }
        }
        goto LAB_00129e4e;
      case XML_ENC_ERR_INPUT:
        iVar3 = 0x51;
        break;
      default:
        iVar3 = 1;
      }
      local_68->error = iVar3;
      cVar7 = '\x01';
      local_74 = xVar2;
LAB_00129e4e:
      len_00 = len_00 + lVar9;
      in = in + lVar9;
      sVar4 = sVar4 - lVar9;
      sVar10 = sVar10 + len;
      uVar8 = uVar8 - len;
    } while (cVar7 == '\0');
    xVar2 = local_74;
    if (cVar7 == '\x03') {
      xmlBufShrink(local_40,len_00);
      uVar6 = 0xffffffffffffffff;
      if (!CARRY8(len_00,local_68->rawconsumed)) {
        uVar6 = len_00 + local_68->rawconsumed;
      }
      local_68->rawconsumed = uVar6;
      *local_38 = sVar10;
      xVar2 = XML_ENC_ERR_SUCCESS;
    }
  }
  return xVar2;
}

Assistant:

xmlCharEncError
xmlCharEncInput(xmlParserInputBufferPtr input, size_t *sizeOut, int flush)
{
    xmlBufPtr out, in;
    const xmlChar *dataIn;
    size_t availIn;
    size_t maxOut;
    size_t totalIn, totalOut;
    xmlCharEncError ret;

    out = input->buffer;
    in = input->raw;

    maxOut = *sizeOut;
    totalOut = 0;

    *sizeOut = 0;

    availIn = xmlBufUse(in);
    if ((availIn == 0) && (!flush))
        return(0);
    dataIn = xmlBufContent(in);
    totalIn = 0;

    while (1) {
        size_t availOut;
        int completeOut, completeIn;
        int c_out, c_in;

        availOut = xmlBufAvail(out);
        if (availOut > INT_MAX / 2)
            availOut = INT_MAX / 2;

        if (availOut < maxOut) {
            c_out = availOut;
            completeOut = 0;
        } else {
            c_out = maxOut;
            completeOut = 1;
        }

        if (availIn > INT_MAX / 2) {
            c_in = INT_MAX / 2;
            completeIn = 0;
        } else {
            c_in = availIn;
            completeIn = 1;
        }

        ret = xmlEncInputChunk(input->encoder, xmlBufEnd(out), &c_out,
                               dataIn, &c_in, flush && completeIn);

        totalIn += c_in;
        dataIn += c_in;
        availIn -= c_in;

        totalOut += c_out;
        maxOut -= c_out;
        xmlBufAddLen(out, c_out);

        if ((ret != XML_ENC_ERR_SUCCESS) && (ret != XML_ENC_ERR_SPACE)) {
            input->error = xmlEncConvertError(ret);
            return(ret);
        }

        if ((completeOut) && (completeIn))
            break;
        if ((completeOut) && (ret == XML_ENC_ERR_SPACE))
            break;
        if ((completeIn) && (ret == XML_ENC_ERR_SUCCESS))
            break;

        if (ret == XML_ENC_ERR_SPACE) {
            if (xmlBufGrow(out, 4096) < 0) {
                input->error = XML_ERR_NO_MEMORY;
                return(XML_ENC_ERR_MEMORY);
            }
        }
    }

    xmlBufShrink(in, totalIn);

    if (input->rawconsumed > ULONG_MAX - (unsigned long) totalIn)
        input->rawconsumed = ULONG_MAX;
    else
        input->rawconsumed += totalIn;

    *sizeOut = totalOut;
    return(XML_ENC_ERR_SUCCESS);
}